

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collectives.hpp
# Opt level: O2

void diy::mpi::Collectives<std::vector<int,_std::allocator<int>_>,_std::plus<int>_>::reduce
               (communicator *comm,vector<int,_std::allocator<int>_> *in,int root,plus<int> *param_4
               )

{
  pointer dataIn;
  pointer piVar1;
  int count;
  operation op;
  datatype local_10;
  operation local_8;
  
  local_8.handle.data = (DIY_MPI_Op)&ompi_mpi_op_sum;
  dataIn = (in->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar1 = (in->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  count = (int)((ulong)((long)piVar1 - (long)dataIn) >> 2);
  if (piVar1 == dataIn) {
    count = 0;
  }
  local_10.handle.data = (DIY_MPI_Datatype)&ompi_mpi_int;
  detail::reduce(comm,dataIn,count,&local_10,dataIn,&local_8,root);
  return;
}

Assistant:

static void reduce(const communicator& comm, const T& in, int root, const Op&)
    {
      auto op = detail::mpi_op<Op>::get();
      detail::reduce(comm, address(in), count(in), datatype_of(in), address(in), op, root);
    }